

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

void __thiscall SceneParser::parsePerspectiveCamera(SceneParser *this)

{
  int iVar1;
  PerspectiveCamera *this_00;
  float fVar2;
  float angle_radians;
  float angle_degrees;
  Vector3f up;
  Vector3f direction;
  Vector3f center;
  char token [100];
  SceneParser *this_local;
  
  getToken(this,(char *)(center.m_elements + 1));
  iVar1 = strcmp((char *)(center.m_elements + 1),"{");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x77,"void SceneParser::parsePerspectiveCamera()");
  }
  getToken(this,(char *)(center.m_elements + 1));
  iVar1 = strcmp((char *)(center.m_elements + 1),"center");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"center\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x79,"void SceneParser::parsePerspectiveCamera()");
  }
  readVector3f((SceneParser *)(direction.m_elements + 1));
  getToken(this,(char *)(center.m_elements + 1));
  iVar1 = strcmp((char *)(center.m_elements + 1),"direction");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"direction\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x7c,"void SceneParser::parsePerspectiveCamera()");
  }
  readVector3f((SceneParser *)(up.m_elements + 1));
  getToken(this,(char *)(center.m_elements + 1));
  iVar1 = strcmp((char *)(center.m_elements + 1),"up");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"up\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x7f,"void SceneParser::parsePerspectiveCamera()");
  }
  readVector3f((SceneParser *)&angle_radians);
  getToken(this,(char *)(center.m_elements + 1));
  iVar1 = strcmp((char *)(center.m_elements + 1),"angle");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"angle\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x82,"void SceneParser::parsePerspectiveCamera()");
  }
  fVar2 = readFloat(this);
  getToken(this,(char *)(center.m_elements + 1));
  iVar1 = strcmp((char *)(center.m_elements + 1),"}");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x86,"void SceneParser::parsePerspectiveCamera()");
  }
  this_00 = (PerspectiveCamera *)operator_new(0x40);
  PerspectiveCamera::PerspectiveCamera
            (this_00,(Vector3f *)(direction.m_elements + 1),(Vector3f *)(up.m_elements + 1),
             (Vector3f *)&angle_radians,(fVar2 * 3.1415927) / 180.0);
  this->_camera = (Camera *)this_00;
  return;
}

Assistant:

void
SceneParser::parsePerspectiveCamera() {
    // Read in the camera parameters.
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "center"));
    Vector3f center = readVector3f();
    getToken(token);
    assert(!strcmp(token, "direction"));
    Vector3f direction = readVector3f();
    getToken(token);
    assert(!strcmp(token, "up"));
    Vector3f up = readVector3f();
    getToken(token);
    assert(!strcmp(token, "angle"));
    float angle_degrees = readFloat();
    float angle_radians = (float) DegreesToRadians(angle_degrees);
    getToken(token);
    assert(!strcmp(token, "}"));
    _camera = new PerspectiveCamera(center, direction, up, angle_radians);
}